

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortRangeInteraction.cpp
# Opt level: O0

void __thiscall OpenMD::ShortRangeInteraction::~ShortRangeInteraction(ShortRangeInteraction *this)

{
  undefined8 *in_RDI;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *unaff_retaddr;
  
  *in_RDI = &PTR__ShortRangeInteraction_005036f8;
  PropertyMap::~PropertyMap((PropertyMap *)0x283cca);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

ShortRangeInteraction::~ShortRangeInteraction() {}